

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O1

int __thiscall
icu_63::PluralRules::select
          (PluralRules *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  FixedDecimal::FixedDecimal((FixedDecimal *)&stack0xffffffffffffffa8,(double)(int)__readfds);
  select(this,__nfds,(fd_set *)&stack0xffffffffffffffa8,__writefds,__exceptfds,__timeout);
  UObject::~UObject((UObject *)&stack0xffffffffffffffb0);
  IFixedDecimal::~IFixedDecimal((IFixedDecimal *)&stack0xffffffffffffffa8);
  return (int)this;
}

Assistant:

UnicodeString
PluralRules::select(int32_t number) const {
    return select(FixedDecimal(number));
}